

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O1

int buildMap(TIFFRGBAImage *img)

{
  ushort *puVar1;
  ushort uVar2;
  uint16_t *puVar3;
  uint16_t *puVar4;
  uint16_t *puVar5;
  TIFF *pTVar6;
  long lVar7;
  uint16_t *r;
  TIFFRGBValue *pTVar8;
  uint32_t **ppuVar9;
  ulong uVar10;
  char *pcVar11;
  byte bVar12;
  sbyte sVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  uint16_t *g;
  uint16_t *b;
  uint32_t **ppuVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  sbyte sVar22;
  uint uVar23;
  uint32_t **ppuVar24;
  uint uVar25;
  ulong uVar26;
  uint32_t **ppuVar27;
  long local_68;
  long local_60;
  uint32_t **local_58;
  long local_50;
  
  uVar2 = img->photometric;
  if (6 < uVar2) {
    return 1;
  }
  if ((100U >> (uVar2 & 0x1f) & 1) == 0) {
    if ((3U >> (uVar2 & 0x1f) & 1) == 0) {
      if (uVar2 != 3) {
        return 1;
      }
      puVar3 = img->redcmap;
      puVar4 = img->greencmap;
      puVar5 = img->bluecmap;
      bVar12 = (byte)img->bitspersample;
      lVar18 = 0;
      lVar7 = 1L << (bVar12 & 0x3f);
      do {
        lVar20 = lVar7;
        if (lVar20 < 1) goto LAB_002a58b1;
        if ((0xff < *(ushort *)((long)puVar3 + lVar18)) ||
           (0xff < *(ushort *)((long)puVar4 + lVar18))) break;
        puVar1 = (ushort *)((long)puVar5 + lVar18);
        lVar18 = lVar18 + 2;
        lVar7 = lVar20 + -1;
      } while (*puVar1 < 0x100);
      if (lVar20 < 1) {
LAB_002a58b1:
        pTVar6 = img->tif;
        pcVar11 = TIFFFileName(pTVar6);
        TIFFWarningExtR(pTVar6,pcVar11,"Assuming 8-bit colormap");
      }
      else {
        lVar18 = -(-1L << (bVar12 & 0x3f));
        do {
          puVar3[lVar18 + -1] = (ushort)*(byte *)((long)puVar3 + lVar18 * 2 + -1);
          puVar4[lVar18 + -1] = (ushort)*(byte *)((long)puVar4 + lVar18 * 2 + -1);
          puVar5[lVar18 + -1] = (ushort)*(byte *)((long)puVar5 + lVar18 * 2 + -1);
          lVar18 = lVar18 + -1;
        } while (0 < lVar18);
      }
      uVar2 = img->bitspersample;
      uVar19 = (ulong)uVar2;
      if (8 < uVar2) {
        return 1;
      }
      puVar3 = img->redcmap;
      puVar4 = img->greencmap;
      puVar5 = img->bluecmap;
      ppuVar9 = (uint32_t **)_TIFFmallocExt(img->tif,(ulong)((uint)(8 / uVar2) * 0x400 + 0x800));
      img->PALmap = ppuVar9;
      if (ppuVar9 == (uint32_t **)0x0) {
        pTVar6 = img->tif;
        pcVar11 = TIFFFileName(pTVar6);
        TIFFErrorExtR(pTVar6,pcVar11,"No space for Palette mapping table");
      }
      else {
        ppuVar17 = ppuVar9 + 0x100;
        uVar21 = 0;
        do {
          img->PALmap[uVar21] = (uint32_t *)ppuVar17;
          lVar18 = 8;
          uVar10 = uVar19;
          switch(uVar2) {
          case 1:
            uVar10 = uVar21 >> 7 & 0x1ffffff;
            *(uint *)ppuVar17 =
                 (uint)puVar5[uVar10] << 0x10 |
                 (puVar4[uVar10] & 0xff) << 8 | (uint)(byte)puVar3[uVar10] | 0xff000000;
            uVar10 = (ulong)((uint)(uVar21 >> 5) & 2);
            *(uint *)((long)ppuVar17 + 4) =
                 (uint)*(ushort *)((long)puVar5 + uVar10) << 0x10 |
                 (*(ushort *)((long)puVar4 + uVar10) & 0xff) << 8 |
                 (uint)*(byte *)((long)puVar3 + uVar10) | 0xff000000;
            uVar10 = (ulong)((uint)(uVar21 >> 4) & 2);
            *(uint *)(ppuVar17 + 1) =
                 (uint)*(ushort *)((long)puVar5 + uVar10) << 0x10 |
                 (*(ushort *)((long)puVar4 + uVar10) & 0xff) << 8 |
                 (uint)*(byte *)((long)puVar3 + uVar10) | 0xff000000;
            uVar10 = (ulong)((uint)(uVar21 >> 3) & 2);
            local_58 = ppuVar17 + 2;
            *(uint *)((long)ppuVar17 + 0xc) =
                 (uint)*(ushort *)((long)puVar5 + uVar10) << 0x10 |
                 (*(ushort *)((long)puVar4 + uVar10) & 0xff) << 8 |
                 (uint)*(byte *)((long)puVar3 + uVar10) | 0xff000000;
            local_60 = 0x20;
            uVar26 = 0x1c;
            lVar18 = 0x18;
            sVar22 = 2;
            local_50 = 0x14;
            uVar23 = 1;
            sVar13 = 3;
            uVar25 = 1;
            uVar10 = 1;
            break;
          case 2:
            local_60 = 0x10;
            uVar26 = 0xc;
            uVar25 = 3;
            local_50 = 4;
            uVar23 = 0x3ffffff;
            sVar13 = 6;
            sVar22 = 4;
            local_58 = ppuVar17;
            break;
          default:
            goto switchD_002a5965_caseD_3;
          case 4:
            uVar25 = 0xfffffff;
            ppuVar24 = ppuVar17;
            local_60 = lVar18;
            uVar26 = uVar19;
            uVar23 = 0xf;
            goto LAB_002a5b39;
          case 8:
            local_60 = 4;
            uVar10 = uVar21;
            ppuVar27 = ppuVar17;
            goto LAB_002a5b8a;
          }
          uVar16 = (ulong)((uVar23 & (uint)(uVar21 >> sVar13)) * 2);
          *(uint *)local_58 =
               (uint)*(ushort *)((long)puVar5 + uVar16) << 0x10 |
               (*(ushort *)((long)puVar4 + uVar16) & 0xff) << 8 |
               (uint)*(byte *)((long)puVar3 + uVar16) | 0xff000000;
          uVar16 = (ulong)((uVar25 & (uint)(uVar21 >> sVar22)) * 2);
          *(uint *)((long)ppuVar17 + local_50) =
               (uint)*(ushort *)((long)puVar5 + uVar16) << 0x10 |
               (*(ushort *)((long)puVar4 + uVar16) & 0xff) << 8 |
               (uint)*(byte *)((long)puVar3 + uVar16) | 0xff000000;
          ppuVar24 = (uint32_t **)(lVar18 + (long)ppuVar17);
          uVar23 = uVar25;
LAB_002a5b39:
          uVar10 = (ulong)((uVar25 & (uint)(uVar21 >> ((byte)uVar10 & 0x3f))) * 2);
          ppuVar27 = (uint32_t **)(uVar26 + (long)ppuVar17);
          *(uint *)ppuVar24 =
               (uint)*(ushort *)((long)puVar5 + uVar10) << 0x10 |
               (*(ushort *)((long)puVar4 + uVar10) & 0xff) << 8 |
               (uint)*(byte *)((long)puVar3 + uVar10) | 0xff000000;
          uVar10 = (ulong)(uVar23 & (uint)uVar21);
LAB_002a5b8a:
          ppuVar17 = (uint32_t **)((long)ppuVar17 + local_60);
          *(uint *)ppuVar27 =
               (uint)puVar5[uVar10] << 0x10 |
               (puVar4[uVar10] & 0xff) << 8 | (uint)(byte)puVar3[uVar10] | 0xff000000;
switchD_002a5965_caseD_3:
          uVar21 = uVar21 + 1;
        } while (uVar21 != 0x100);
      }
      if (ppuVar9 == (uint32_t **)0x0) {
        return 0;
      }
      return 1;
    }
  }
  else if (img->bitspersample == 8) {
    return 1;
  }
  uVar23 = 0xff;
  if (img->bitspersample != 0x10) {
    uVar23 = ~(uint)(-1L << ((byte)img->bitspersample & 0x3f));
  }
  uVar25 = uVar23 + 1;
  pTVar8 = (TIFFRGBValue *)_TIFFmallocExt(img->tif,(long)(int)uVar25);
  img->Map = pTVar8;
  if (pTVar8 == (TIFFRGBValue *)0x0) {
    pTVar6 = img->tif;
    pcVar11 = TIFFFileName(pTVar6);
    TIFFErrorExtR(pTVar6,pcVar11,"No space for photometric conversion table");
    return 0;
  }
  if (img->photometric == 0) {
    if (-1 < (int)uVar23) {
      iVar15 = uVar23 * 0xff;
      uVar19 = 0;
      do {
        img->Map[uVar19] = (TIFFRGBValue)(iVar15 / (int)uVar23);
        uVar19 = uVar19 + 1;
        iVar15 = iVar15 + -0xff;
      } while (uVar25 != uVar19);
    }
  }
  else if (-1 < (int)uVar23) {
    uVar14 = 0;
    uVar19 = 0;
    do {
      img->Map[uVar19] = (TIFFRGBValue)(uVar14 / uVar23);
      uVar19 = uVar19 + 1;
      uVar14 = uVar14 + 0xff;
    } while (uVar25 != uVar19);
  }
  uVar2 = img->bitspersample;
  uVar19 = (ulong)uVar2;
  if ((uVar2 < 0x11) && (img->photometric < 2)) {
    pTVar8 = img->Map;
    uVar23 = 0xc00;
    if (uVar2 < 9) {
      uVar23 = (uint)(8 / uVar2) * 0x400 + 0x800;
    }
    ppuVar9 = (uint32_t **)_TIFFmallocExt(img->tif,(ulong)uVar23);
    img->BWmap = ppuVar9;
    if (ppuVar9 == (uint32_t **)0x0) {
      pTVar6 = img->tif;
      pcVar11 = TIFFFileName(pTVar6);
      TIFFErrorExtR(pTVar6,pcVar11,"No space for B&W mapping table");
    }
    else {
      ppuVar17 = ppuVar9 + 0x100;
      uVar21 = 0;
      do {
        img->BWmap[uVar21] = (uint32_t *)ppuVar17;
        lVar18 = 8;
        uVar23 = (uint)uVar21;
        uVar10 = uVar19;
        switch(uVar2) {
        case 1:
          *(uint *)ppuVar17 = (uint)pTVar8[uVar21 >> 7 & 0x1ffffff] * 0x10101 | 0xff000000;
          *(uint *)((long)ppuVar17 + 4) =
               (uint)pTVar8[(uVar23 >> 6 & 1) != 0] * 0x10101 | 0xff000000;
          *(uint *)(ppuVar17 + 1) = (uint)pTVar8[(uVar23 >> 5 & 1) != 0] * 0x10101 | 0xff000000;
          ppuVar27 = ppuVar17 + 2;
          *(uint *)((long)ppuVar17 + 0xc) =
               (uint)pTVar8[(uVar23 >> 4 & 1) != 0] * 0x10101 | 0xff000000;
          local_60 = 0x20;
          uVar26 = 0x1c;
          lVar18 = 0x18;
          sVar22 = 2;
          local_68 = 0x14;
          uVar25 = 1;
          sVar13 = 3;
          uVar14 = 1;
          uVar10 = 1;
          goto LAB_002a57f1;
        case 2:
          local_60 = 0x10;
          uVar26 = 0xc;
          uVar14 = 3;
          local_68 = 4;
          uVar25 = 0x3ffffff;
          sVar13 = 6;
          sVar22 = 4;
          ppuVar27 = ppuVar17;
LAB_002a57f1:
          *(uint *)ppuVar27 = (uint)pTVar8[uVar25 & (uint)(uVar21 >> sVar13)] * 0x10101 | 0xff000000
          ;
          ppuVar24 = (uint32_t **)(lVar18 + (long)ppuVar17);
          *(uint *)((long)ppuVar17 + local_68) =
               (uint)pTVar8[uVar14 & (uint)(uVar21 >> sVar22)] * 0x10101 | 0xff000000;
          uVar25 = uVar14;
LAB_002a585d:
          ppuVar27 = (uint32_t **)(uVar26 + (long)ppuVar17);
          *(uint *)ppuVar24 =
               (uint)pTVar8[uVar14 & (uint)(uVar21 >> ((byte)uVar10 & 0x3f))] * 0x10101 | 0xff000000
          ;
          uVar10 = (ulong)(uVar25 & uVar23);
LAB_002a5885:
          ppuVar17 = (uint32_t **)((long)ppuVar17 + local_60);
          *(uint *)ppuVar27 = (uint)pTVar8[uVar10] * 0x10101 | 0xff000000;
          break;
        case 3:
        case 5:
        case 6:
        case 7:
          break;
        case 4:
          uVar14 = 0xfffffff;
          ppuVar24 = ppuVar17;
          local_60 = lVar18;
          uVar26 = uVar19;
          uVar25 = 0xf;
          goto LAB_002a585d;
        case 8:
switchD_002a56f4_caseD_8:
          local_60 = 4;
          uVar10 = uVar21;
          ppuVar27 = ppuVar17;
          goto LAB_002a5885;
        default:
          if (uVar2 == 0x10) goto switchD_002a56f4_caseD_8;
        }
        uVar21 = uVar21 + 1;
      } while (uVar21 != 0x100);
    }
    if (ppuVar9 == (uint32_t **)0x0) {
      return 0;
    }
    _TIFFfreeExt(img->tif,img->Map);
    img->Map = (TIFFRGBValue *)0x0;
  }
  return 1;
}

Assistant:

static int buildMap(TIFFRGBAImage *img)
{
    switch (img->photometric)
    {
        case PHOTOMETRIC_RGB:
        case PHOTOMETRIC_YCBCR:
        case PHOTOMETRIC_SEPARATED:
            if (img->bitspersample == 8)
                break;
            /* fall through... */
        case PHOTOMETRIC_MINISBLACK:
        case PHOTOMETRIC_MINISWHITE:
            if (!setupMap(img))
                return (0);
            break;
        case PHOTOMETRIC_PALETTE:
            /*
             * Convert 16-bit colormap to 8-bit (unless it looks
             * like an old-style 8-bit colormap).
             */
            if (checkcmap(img) == 16)
                cvtcmap(img);
            else
                TIFFWarningExtR(img->tif, TIFFFileName(img->tif),
                                "Assuming 8-bit colormap");
            /*
             * Use mapping table and colormap to construct
             * unpacking tables for samples < 8 bits.
             */
            if (img->bitspersample <= 8 && !makecmap(img))
                return (0);
            break;
    }
    return (1);
}